

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

opj_bool j2k_read_mco(opj_j2k_v2_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                     opj_event_mgr *p_manager)

{
  long lVar1;
  ulong uVar2;
  opj_event_mgr_t *poVar3;
  opj_bool oVar4;
  opj_tcp_v2_t *p_tcp;
  opj_event_mgr_t *in_RCX;
  int in_EDX;
  OPJ_BYTE *in_RSI;
  long in_RDI;
  opj_image_comp_t *l_img_comp;
  opj_image_t *l_image;
  opj_tccp_t *l_tccp;
  opj_tcp_v2_t *l_tcp;
  OPJ_UINT32 l_nb_stages;
  OPJ_UINT32 i;
  OPJ_UINT32 l_tmp;
  long local_60;
  long local_48;
  uint local_34;
  uint local_30;
  OPJ_UINT32 local_2c [2];
  undefined4 in_stack_ffffffffffffffe0;
  opj_bool local_4;
  
  lVar1 = *(long *)(in_RDI + 0x60);
  if (*(int *)(in_RDI + 8) == 0x10) {
    local_60 = *(long *)(in_RDI + 0xd0) + (ulong)*(uint *)(in_RDI + 0x118) * 0x1630;
  }
  else {
    local_60 = *(long *)(in_RDI + 0x10);
  }
  if (in_EDX == 0) {
    opj_event_msg_v2(in_RCX,1,"Error reading MCO marker\n");
    local_4 = 0;
  }
  else {
    unique0x1000019a = in_RCX;
    opj_read_bytes_LE(in_RSI,&local_34,1);
    p_tcp = (opj_tcp_v2_t *)(in_RSI + 1);
    if (local_34 < 2) {
      if (in_EDX == local_34 + 1) {
        local_48 = *(long *)(local_60 + 0x15d0);
        for (local_30 = 0; local_30 < *(uint *)(lVar1 + 0x10); local_30 = local_30 + 1) {
          *(undefined4 *)(local_48 + 0x434) = 0;
          local_48 = local_48 + 0x438;
        }
        if (*(long *)(local_60 + 0x15f8) != 0) {
          free(*(void **)(local_60 + 0x15f8));
          *(undefined8 *)(local_60 + 0x15f8) = 0;
        }
        for (local_30 = 0; local_30 < local_34; local_30 = local_30 + 1) {
          opj_read_bytes_LE((OPJ_BYTE *)p_tcp,local_2c,1);
          poVar3 = stack0xffffffffffffffd8;
          p_tcp = (opj_tcp_v2_t *)((long)&p_tcp->csty + 1);
          uVar2 = (ulong)stack0xffffffffffffffd8 >> 0x20;
          oVar4 = j2k_add_mct(p_tcp,(opj_image_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                              (OPJ_UINT32)uVar2);
          stack0xffffffffffffffd8 = poVar3;
          if (oVar4 == 0) {
            return 0;
          }
        }
        local_4 = 1;
      }
      else {
        opj_event_msg_v2(stack0xffffffffffffffd8,2,"Error reading MCO marker\n");
        local_4 = 0;
      }
    }
    else {
      opj_event_msg_v2(stack0xffffffffffffffd8,2,
                       "Cannot take in charge multiple transformation stages.\n");
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

opj_bool j2k_read_mco (	opj_j2k_v2_t *p_j2k,
						OPJ_BYTE * p_header_data,
						OPJ_UINT32 p_header_size,
						struct opj_event_mgr * p_manager )
{
	OPJ_UINT32 l_tmp, i;
	OPJ_UINT32 l_nb_stages;
	opj_tcp_v2_t * l_tcp;
	opj_tccp_t * l_tccp;
	opj_image_t * l_image;
	opj_image_comp_t * l_img_comp;

	/* preconditions */
	assert(p_header_data != 00);
	assert(p_j2k != 00);
	assert(p_manager != 00);

	l_image = p_j2k->m_private_image;
	l_tcp = p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_TPH ?
			&p_j2k->m_cp.tcps[p_j2k->m_current_tile_number] :
			p_j2k->m_specific_param.m_decoder.m_default_tcp;

	if (p_header_size < 1) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading MCO marker\n");
		return OPJ_FALSE;
	}

	opj_read_bytes(p_header_data,&l_nb_stages,1);				/* Nmco : only one tranform stage*/
	++p_header_data;

	if (l_nb_stages > 1) {
		opj_event_msg_v2(p_manager, EVT_WARNING, "Cannot take in charge multiple transformation stages.\n");
		return OPJ_TRUE;
	}

	if (p_header_size != l_nb_stages + 1) {
		opj_event_msg_v2(p_manager, EVT_WARNING, "Error reading MCO marker\n");
		return OPJ_FALSE;
	}

	l_tccp = l_tcp->tccps;
	l_img_comp = l_image->comps;

	for (i=0;i<l_image->numcomps;++i) {
		l_tccp->m_dc_level_shift = 0;
		++l_tccp;
	}

	if (l_tcp->m_mct_decoding_matrix) {
		opj_free(l_tcp->m_mct_decoding_matrix);
		l_tcp->m_mct_decoding_matrix = 00;
	}

	for (i=0;i<l_nb_stages;++i) {
		opj_read_bytes(p_header_data,&l_tmp,1);
		++p_header_data;

		if (! j2k_add_mct(l_tcp,p_j2k->m_private_image,l_tmp)) {
			return OPJ_FALSE;
		}
	}

	return OPJ_TRUE;
}